

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readScatteringLaw.hpp
# Opt level: O2

ScatteringLaw * __thiscall
njoy::ENDFtk::section::Type<7,4>::
readScatteringLaw<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (ScatteringLaw *__return_storage_ptr__,Type<7,4> *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT,int MF,int MT,double B1)

{
  InterpolationSequenceRecord<njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions::ScatteringFunction>
  local_88;
  
  if ((B1 != 0.0) || (NAN(B1))) {
    TabulatedFunctions::TabulatedFunctions<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((TabulatedFunctions *)&local_88,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,begin,(long *)end,(int)lineNumber,MAT,MF);
    std::
    variant<njoy::ENDFtk::section::Type<7,4>::AnalyticalFunctions,njoy::ENDFtk::section::Type<7,4>::TabulatedFunctions>
    ::
    variant<njoy::ENDFtk::section::Type<7,4>::TabulatedFunctions,void,void,njoy::ENDFtk::section::Type<7,4>::TabulatedFunctions,void>
              ((variant<njoy::ENDFtk::section::Type<7,4>::AnalyticalFunctions,njoy::ENDFtk::section::Type<7,4>::TabulatedFunctions>
                *)__return_storage_ptr__,(TabulatedFunctions *)&local_88);
    InterpolationSequenceRecord<njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions::ScatteringFunction>
    ::~InterpolationSequenceRecord(&local_88);
  }
  else {
    (__return_storage_ptr__->
    super__Variant_base<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
    ).
    super__Move_assign_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
    .
    super__Copy_assign_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
    .
    super__Move_ctor_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
    .
    super__Copy_ctor_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
    .
    super__Variant_storage_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
    ._M_index = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

static ScatteringLaw
readScatteringLaw( Iterator& begin,
                   const Iterator& end,
                   long& lineNumber,
                   int MAT,
                   int MF,
                   int MT,
                   double B1 ) {

  if ( B1 == 0.0 ) {

    return AnalyticalFunctions();
  }
  else {
    
    return TabulatedFunctions( begin, end, lineNumber, MAT, MF, MT );
  }
}